

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall
iu_MatcherFailure_x_iutest_x_ContainerEq_Test::Body
          (iu_MatcherFailure_x_iutest_x_ContainerEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag TVar2;
  TestPartResultReporterInterface *pTVar3;
  TestFlag *pTVar4;
  Variable *pVVar5;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  size_type __dnew;
  TestFlag local_43c;
  AssertionResult local_438;
  detail *local_410;
  long local_400 [2];
  string local_3f0;
  AssertionResult local_3d0;
  AssertionHelper local_3a8;
  SPIFailureChecker local_378;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__ContainerEqMatcher_0023f350;
  local_340._8_8_ = (anonymous_namespace)::gc;
  local_330._8_8_ = 0;
  local_320[0]._M_local_buf[0] = '\0';
  local_330._M_allocated_capacity = (size_type)local_320;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&local_438,(ContainerEqMatcher<int[3]> *)local_340,
             (int (*) [3])(anonymous_namespace)::gb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_allocated_capacity != local_320) {
    operator_delete((void *)local_330._M_allocated_capacity,
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<int[3]>::Print
              ((int (*) [3])(anonymous_namespace)::gb,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"ContainerEq(gc)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x27e;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar2.m_test_flags = local_43c.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_1b8._0_8_ = (int (*) [3])0x18;
  local_340._0_8_ = &local_330;
  local_340._0_8_ = std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity = local_1b8._0_8_;
  *(undefined8 *)local_340._0_8_ = 0x656e6961746e6f43;
  *(undefined8 *)(local_340._0_8_ + 8) = 0x31207b203a714572;
  *(size_type *)(local_340._0_8_ + 0x10) = 0x7d2031202c31202c;
  local_340._8_8_ = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,(ulong)(local_330._M_allocated_capacity + 1));
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = pTVar3;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000027e;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((int (*) [3])local_1b8._0_8_ != (int (*) [3])(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  paVar1 = &local_3d0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__ContainerEqMatcher_0023f350;
  local_340._8_8_ = (anonymous_namespace)::gc;
  local_330._8_8_ = 0;
  local_320[0]._M_local_buf[0] = '\0';
  local_330._M_allocated_capacity = (size_type)local_320;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&local_438,(ContainerEqMatcher<int[3]> *)local_340,
             (int (*) [3])(anonymous_namespace)::gb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_allocated_capacity != local_320) {
    operator_delete((void *)local_330._M_allocated_capacity,
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<int[3]>::Print
              ((int (*) [3])(anonymous_namespace)::gb,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"ContainerEq(gc)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x27f;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar2.m_test_flags = local_43c.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_1b8._0_8_ = (int (*) [3])0x20;
  local_340._0_8_ = &local_330;
  local_340._0_8_ = std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity = local_1b8._0_8_;
  *(undefined8 *)(local_340._0_8_ + 0x10) = 0x31206e6f69746973;
  *(undefined8 *)(local_340._0_8_ + 0x18) = 0x322073762031203a;
  *(undefined8 *)local_340._0_8_ = 0x686374616d73694d;
  *(undefined8 *)(local_340._0_8_ + 8) = 0x6f702061206e6920;
  local_340._8_8_ = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,(ulong)(local_330._M_allocated_capacity + 1));
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = pTVar3;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000027f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((int (*) [3])local_1b8._0_8_ != (int (*) [3])(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__ContainerEqMatcher_0023f350;
  local_340._8_8_ = (anonymous_namespace)::gc;
  local_330._8_8_ = 0;
  local_320[0]._M_local_buf[0] = '\0';
  local_330._M_allocated_capacity = (size_type)local_320;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&local_438,(ContainerEqMatcher<int[3]> *)local_340,
             (int (*) [3])(anonymous_namespace)::gb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_allocated_capacity != local_320) {
    operator_delete((void *)local_330._M_allocated_capacity,
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<int[3]>::Print
              ((int (*) [3])(anonymous_namespace)::gb,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"ContainerEq(gc)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x280;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar2.m_test_flags = local_43c.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_1b8._0_8_ = (int (*) [3])0x20;
  local_340._0_8_ = &local_330;
  local_340._0_8_ = std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity = local_1b8._0_8_;
  *(undefined8 *)(local_340._0_8_ + 0x10) = 0x32206e6f69746973;
  *(undefined8 *)(local_340._0_8_ + 0x18) = 0x332073762031203a;
  *(undefined8 *)local_340._0_8_ = 0x686374616d73694d;
  *(undefined8 *)(local_340._0_8_ + 8) = 0x6f702061206e6920;
  local_340._8_8_ = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,(ulong)(local_330._M_allocated_capacity + 1));
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = pTVar3;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000280;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((int (*) [3])local_1b8._0_8_ != (int (*) [3])(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__ContainerEqMatcher_0023f350;
  local_340._8_8_ = (anonymous_namespace)::gc;
  local_330._8_8_ = 0;
  local_320[0]._M_local_buf[0] = '\0';
  local_330._M_allocated_capacity = (size_type)local_320;
  iutest::detail::ContainerEqMatcher<int[3]>::operator()
            (&local_438,(ContainerEqMatcher<int[3]> *)local_340,
             (int (*) [10])(anonymous_namespace)::ga);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_allocated_capacity != local_320) {
    operator_delete((void *)local_330._M_allocated_capacity,
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<int[10]>::Print
              ((int (*) [10])(anonymous_namespace)::ga,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"ContainerEq(gc)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x281;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar2.m_test_flags = local_43c.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_1b8._0_8_ = (int (*) [3])0x1a;
  local_340._0_8_ = &local_330;
  local_340._0_8_ = std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + 10) = 'l';
  *(char *)(local_340._0_8_ + 0xb) = 'e';
  *(char *)(local_340._0_8_ + 0xc) = 'm';
  *(char *)(local_340._0_8_ + 0xd) = 'e';
  *(char *)(local_340._0_8_ + 0xe) = 'n';
  *(char *)(local_340._0_8_ + 0xf) = 't';
  *(char *)(local_340._0_8_ + 0x10) = ' ';
  *(char *)(local_340._0_8_ + 0x11) = ':';
  builtin_strncpy((char *)(local_340._0_8_ + 0x12)," 3 vs 10",8);
  *(undefined8 *)local_340._0_8_ = 0x686374616d73694d;
  *(undefined8 *)(local_340._0_8_ + 8) = 0x746e656d656c6520;
  local_340._8_8_ = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,(ulong)(local_330._M_allocated_capacity + 1));
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = pTVar3;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000281;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((int (*) [3])local_1b8._0_8_ != (int (*) [3])(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__ContainerEqMatcher_00240fa0;
  local_340._8_8_ = (anonymous_namespace)::ga;
  local_330._8_8_ = 0;
  local_320[0]._M_local_buf[0] = '\0';
  local_330._M_allocated_capacity = (size_type)local_320;
  iutest::detail::ContainerEqMatcher<int[10]>::operator()
            (&local_438,(ContainerEqMatcher<int[10]> *)local_340,
             (int (*) [3])(anonymous_namespace)::gc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_allocated_capacity != local_320) {
    operator_delete((void *)local_330._M_allocated_capacity,
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<int[3]>::Print
              ((int (*) [3])(anonymous_namespace)::gc,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"ContainerEq(ga)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x282;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = local_43c.m_test_flags;
  local_1b8._0_8_ = (int (*) [3])0x1a;
  local_340._0_8_ = &local_330;
  local_340._0_8_ = std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + 10) = 'l';
  *(char *)(local_340._0_8_ + 0xb) = 'e';
  *(char *)(local_340._0_8_ + 0xc) = 'm';
  *(char *)(local_340._0_8_ + 0xd) = 'e';
  *(char *)(local_340._0_8_ + 0xe) = 'n';
  *(char *)(local_340._0_8_ + 0xf) = 't';
  *(char *)(local_340._0_8_ + 0x10) = ' ';
  *(char *)(local_340._0_8_ + 0x11) = ':';
  builtin_strncpy((char *)(local_340._0_8_ + 0x12)," 10 vs 3",8);
  *(undefined8 *)local_340._0_8_ = 0x686374616d73694d;
  *(undefined8 *)(local_340._0_8_ + 8) = 0x746e656d656c6520;
  local_340._8_8_ = local_1b8._0_8_;
  *(char *)(local_340._0_8_ + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,(ulong)(local_330._M_allocated_capacity + 1));
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter =
       local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000282;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((int (*) [3])local_1b8._0_8_ != (int (*) [3])(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, ContainerEq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "ContainerEq: { 1, 1, 1 }" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "Mismatch in a position 1: 1 vs 2" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, ContainerEq(gc)), "Mismatch in a position 2: 1 vs 3" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(ga, ContainerEq(gc)), "Mismatch element : 3 vs 10" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gc, ContainerEq(ga)), "Mismatch element : 10 vs 3" );
}